

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

void __thiscall
glcts::ArraysOfArrays::ExpressionsIndexingScalar4<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (ExpressionsIndexingScalar4<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  TestError *this_00;
  int local_94;
  undefined1 local_90 [4];
  int sub_script_index;
  uint local_70;
  int permutation;
  undefined4 local_5c;
  string local_58 [4];
  int test_array_dimensions;
  string shader_source;
  string base_shader_string;
  TestShaderType tested_shader_type_local;
  ExpressionsIndexingScalar4<glcts::ArraysOfArrays::Interface::ES> *this_local;
  
  std::__cxx11::string::string((string *)(shader_source.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_58);
  local_5c = 4;
  std::__cxx11::string::operator=
            ((string *)(shader_source.field_2._M_local_buf + 8),"float a[1][2][3][4];\n");
  std::__cxx11::string::operator+=
            ((string *)(shader_source.field_2._M_local_buf + 8),"float b = 2.0;\n\n");
  std::__cxx11::string::operator+=
            ((string *)(shader_source.field_2._M_local_buf + 8),(string *)shader_start_abi_cxx11_);
  for (local_70 = 0; (int)local_70 < 0x10; local_70 = local_70 + 1) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&shader_source.field_2 + 8),"    a");
    std::__cxx11::string::operator=(local_58,(string *)local_90);
    std::__cxx11::string::~string((string *)local_90);
    for (local_94 = 3; -1 < local_94; local_94 = local_94 + -1) {
      if ((local_70 & 1 << ((byte)local_94 & 0x1f)) == 0) {
        std::__cxx11::string::operator+=(local_58,"[]");
      }
      else {
        std::__cxx11::string::operator+=(local_58,"[0]");
      }
    }
    std::__cxx11::string::operator+=(local_58," = b;\n");
    if (local_70 != 0xf) {
      switch(tested_shader_type) {
      case FRAGMENT_SHADER_TYPE:
        break;
      case VERTEX_SHADER_TYPE:
        std::__cxx11::string::operator+=(local_58,"\n\tgl_Position = vec4(0.0);\n");
        break;
      case COMPUTE_SHADER_TYPE:
        break;
      case GEOMETRY_SHADER_TYPE:
        std::__cxx11::string::operator+=(local_58,(string *)emit_quad_abi_cxx11_);
        break;
      case TESSELATION_CONTROL_SHADER_TYPE:
        std::__cxx11::string::operator+=(local_58,(string *)set_tesseation_abi_cxx11_);
        break;
      case TESSELATION_EVALUATION_SHADER_TYPE:
        break;
      default:
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Unrecognized shader type.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                   ,0xc51);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      std::__cxx11::string::operator+=(local_58,(string *)shader_end_abi_cxx11_);
      (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.
        super_TestNode._vptr_TestNode[8])(this,(ulong)tested_shader_type,local_58);
    }
  }
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string((string *)(shader_source.field_2._M_local_buf + 8));
  return;
}

Assistant:

void ExpressionsIndexingScalar4<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string base_shader_string;
	std::string shader_source;

	const int test_array_dimensions = 4;

	base_shader_string = "float a[1][2][3][4];\n";
	base_shader_string += "float b = 2.0;\n\n";
	base_shader_string += shader_start;

	for (int permutation = 0; permutation < (1 << test_array_dimensions); permutation++)
	{
		shader_source = base_shader_string + "    a";

		for (int sub_script_index = test_array_dimensions - 1; sub_script_index >= 0; sub_script_index--)
		{
			if (permutation & (1 << sub_script_index))
			{
				shader_source += "[0]";
			}
			else
			{
				shader_source += "[]";
			}
		}

		shader_source += " = b;\n";

		if (permutation != (1 << test_array_dimensions) - 1)
		{
			/* End main */
			DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

			/* Execute test */
			this->execute_negative_test(tested_shader_type, shader_source);
		} /* if (permutation != (1 << test_array_dimensions) - 1) */
	}	 /* for (int permutation = 0; ...) */
}